

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsmanal.cpp
# Opt level: O2

void __thiscall
TPZSubMeshAnalysis::TPZSubMeshAnalysis(TPZSubMeshAnalysis *this,TPZSubCompMesh *mesh)

{
  int64_t newRows;
  
  TPZLinearAnalysis::TPZLinearAnalysis
            (&this->super_TPZLinearAnalysis,&PTR_PTR_017a01e8,&mesh->super_TPZCompMesh,true,
             (ostream *)&std::cout);
  (this->super_TPZLinearAnalysis).super_TPZAnalysis.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSubMeshAnalysis_017a00d8;
  TPZFMatrix<double>::TPZFMatrix(&this->fReferenceSolution);
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer
            (&this->fReducableStiff,(TPZMatrix<double> *)0x0);
  this->fMesh = mesh;
  if (mesh != (TPZSubCompMesh *)0x0) {
    newRows = TPZCompMesh::NEquations((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh);
    TPZFMatrix<double>::Redim(&this->fReferenceSolution,newRows,1);
  }
  return;
}

Assistant:

TPZSubMeshAnalysis::TPZSubMeshAnalysis(TPZSubCompMesh *mesh) : TPZRegisterClassId(&TPZSubMeshAnalysis::ClassId),
TPZLinearAnalysis(mesh,true), fReducableStiff(0){
	fMesh = mesh;
    if (fMesh)
    {
        fReferenceSolution.Redim(fCompMesh->NEquations(),1);
    }
}